

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void duckdb_je_free(void *ptr)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar2 = __tls_get_addr(&PTR_02494380);
  uVar4 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  if ((*(ulong *)(lVar2 + 0x1b8 + uVar4) == ((ulong)ptr & 0xffffffffc0000000)) &&
     (uVar4 = *(ulong *)(*(long *)(uVar4 + lVar2 + 0x1c0) +
                        (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8)), (uVar4 & 1) != 0)) {
    uVar4 = uVar4 >> 0x30;
    uVar3 = duckdb_je_sz_index2size_tab[uVar4] + *(long *)(lVar2 + 0x350);
    if ((uVar3 < *(ulong *)(lVar2 + 0x358)) &&
       (lVar1 = *(long *)(lVar2 + 0x368 + uVar4 * 0x18),
       *(short *)(lVar2 + 0x37a + uVar4 * 0x18) != (short)lVar1)) {
      *(long *)(lVar2 + uVar4 * 0x18 + 0x368) = lVar1 + -8;
      *(void **)(lVar1 + -8) = ptr;
      *(ulong *)(lVar2 + 0x350) = uVar3;
      return;
    }
  }
  duckdb_je_free_default(ptr);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_free(void *ptr) {
	LOG("core.free.entry", "ptr: %p", ptr);

	je_free_impl(ptr);

	LOG("core.free.exit", "");
}